

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

int QUtil::call_main_from_wmain
              (int argc,wchar_t **argv,function<int_(int,_const_char_*const_*)> *realmain)

{
  function<int_(int,_char_**)> *realmain_00;
  int iVar1;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_30;
  function<int_(int,_char_**)> *local_20;
  undefined8 uStack_18;
  
  std::function<int_(int,_const_char_*const_*)>::function
            ((function<int_(int,_const_char_*const_*)> *)&local_30,realmain);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x20);
  realmain_00 = local_20;
  *(undefined8 *)local_58._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = uStack_18;
  if (local_20 != (function<int_(int,_char_**)> *)0x0) {
    *(void **)local_58._M_unused._0_8_ = local_30._M_unused._M_object;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_30._8_8_;
    *(function<int_(int,_char_**)> **)((long)local_58._M_unused._0_8_ + 0x10) = local_20;
    local_20 = (function<int_(int,_char_**)> *)0x0;
    uStack_18 = 0;
  }
  pcStack_40 = std::
               _Function_handler<int_(int,_char_**),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QUtil.cc:1937:53)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<int_(int,_char_**),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QUtil.cc:1937:53)>
             ::_M_manager;
  iVar1 = ::call_main_from_wmain(SUB41(argc,0),(int)argv,(wchar_t **)&local_58,realmain_00);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return iVar1;
}

Assistant:

int
QUtil::call_main_from_wmain(
    int argc, wchar_t const* const argv[], std::function<int(int, char const* const[])> realmain)
{
    return ::call_main_from_wmain(true, argc, argv, [realmain](int new_argc, char* new_argv[]) {
        return realmain(new_argc, new_argv);
    });
}